

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_pixel_format.h
# Opt level: O2

bool crnlib::pixel_format_helpers::is_pixel_format_non_srgb(pixel_format fmt)

{
  bool bVar1;
  
  bVar1 = true;
  if ((((fmt != PIXEL_FMT_DXT5A) && (fmt != PIXEL_FMT_3DC)) && (fmt != PIXEL_FMT_DXT5_AGBR)) &&
     (((fmt != PIXEL_FMT_DXT5_xGBR && (fmt != PIXEL_FMT_DXT5_xGxR)) &&
      ((fmt != PIXEL_FMT_DXN && (fmt != PIXEL_FMT_DXT5_CCxY)))))) {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

inline bool is_pixel_format_non_srgb(pixel_format fmt) {
  switch (fmt) {
    case PIXEL_FMT_3DC:
    case PIXEL_FMT_DXN:
    case PIXEL_FMT_DXT5A:
    case PIXEL_FMT_DXT5_CCxY:
    case PIXEL_FMT_DXT5_xGxR:
    case PIXEL_FMT_DXT5_xGBR:
    case PIXEL_FMT_DXT5_AGBR:
      return true;
    default:
      break;
  }
  return false;
}